

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

void polyscope::exception(string *message)

{
  long *plVar1;
  ostream *poVar2;
  runtime_error *this;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,options::printPrefix_abi_cxx11_,
             DAT_005fdb20 + options::printPrefix_abi_cxx11_);
  std::__cxx11::string::append((char *)local_60);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_60,(ulong)(message->_M_dataplus)._M_p);
  local_40 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_40 == plVar3) {
    local_30 = *plVar3;
    lStack_28 = plVar1[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
  }
  local_38 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)message,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (0 < options::verbosity) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(message->_M_dataplus)._M_p,message->_M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)message);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void exception(std::string message) {

  message = options::printPrefix + " [EXCEPTION] " + message;

  if (options::verbosity > 0) {
    std::cout << message << std::endl;
  }

  throw std::runtime_error(message);
}